

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void DominantCostRangeInit(DominantCostRange *c)

{
  DominantCostRange *c_local;
  
  c->literal_max_ = 0;
  c->literal_min_ = 0xffffffffffffffff;
  c->red_max_ = 0;
  c->red_min_ = 0xffffffffffffffff;
  c->blue_max_ = 0;
  c->blue_min_ = 0xffffffffffffffff;
  return;
}

Assistant:

static void DominantCostRangeInit(DominantCostRange* const c) {
  c->literal_max_ = 0;
  c->literal_min_ = WEBP_UINT64_MAX;
  c->red_max_ = 0;
  c->red_min_ = WEBP_UINT64_MAX;
  c->blue_max_ = 0;
  c->blue_min_ = WEBP_UINT64_MAX;
}